

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.cpp
# Opt level: O3

void pzgeom::TPZGeoPyramid::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  TPZGeoNode *this;
  long lVar7;
  long lVar8;
  int i_1;
  TPZManVector<long,_5> nodeindexes;
  int64_t index;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZVec<long> local_128;
  long local_108 [5];
  undefined1 local_e0 [8];
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZVec<long>::TPZVec(&local_128,0);
  local_128._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0188d9a8;
  local_128.fNElements = 5;
  local_128.fNAlloc = 0;
  pdVar4 = size->fStore;
  pdVar5 = lowercorner->fStore;
  lVar8 = 0;
  do {
    local_a0.super_TPZVec<double>.fStore[lVar8] = pdVar4[lVar8] / 3.0;
    local_68.super_TPZVec<double>.fStore[lVar8] = pdVar5[lVar8] + 0.5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  local_128.fStore = local_108;
  do {
    pztopology::TPZPyramid::ParametricDomainNodeCoord((int)lVar8,&local_d8.super_TPZVec<double>);
    lVar7 = 0;
    do {
      dVar1 = local_a0.super_TPZVec<double>.fStore[lVar7];
      dVar2 = local_d8.super_TPZVec<double>.fStore[lVar7];
      dVar3 = local_68.super_TPZVec<double>.fStore[lVar7];
      iVar6 = rand();
      local_d8.super_TPZVec<double>.fStore[lVar7] =
           ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 * dVar2 + dVar3 + -0.1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    iVar6 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_128.fStore[lVar8] = (long)iVar6;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar6);
    TPZGeoNode::Initialize(this,&local_d8.super_TPZVec<double>,gmesh);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,5,&local_128,(ulong)(uint)matid,local_e0,1);
  if (local_128.fStore != local_108) {
    local_128.fNAlloc = 0;
    local_128._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_128.fStore != (long *)0x0) {
      operator_delete__(local_128.fStore);
    }
  }
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void
    TPZGeoPyramid::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size) {
        TPZManVector<REAL, 3> co(3), shift(3), scale(3);
        TPZManVector<int64_t, 5> nodeindexes(5);
        for (int i = 0; i < 3; i++) {
            scale[i] = size[i] / 3.;
            shift[i] = 1. / 2. + lowercorner[i];
        }

        for (int i = 0; i < NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            for (int j = 0; j < 3; j++) {
                co[j] = shift[j] + scale[j] * co[j] + (rand() * 0.2 / RAND_MAX) - 0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(EPiramide, nodeindexes, matid, index);
    }